

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleoption.h
# Opt level: O0

void __thiscall
QStyleOptionComboBox::QStyleOptionComboBox(QStyleOptionComboBox *this,QStyleOptionComboBox *other)

{
  QFlags<Qt::AlignmentFlag> QVar1;
  QStyleOptionComboBox *in_RSI;
  QStyleOptionComboBox *in_RDI;
  
  QStyleOptionComplex::QStyleOptionComplex
            (&in_RSI->super_QStyleOptionComplex,(int)((ulong)in_RDI >> 0x20),(int)in_RDI);
  QRect::QRect((QRect *)in_RSI);
  QString::QString((QString *)0x44d4a4);
  QIcon::QIcon(&in_RDI->currentIcon);
  QSize::QSize((QSize *)in_RSI);
  QVar1 = Qt::operator|((enum_type)((ulong)in_RSI >> 0x20),(enum_type)in_RSI);
  (in_RDI->textAlignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
  super_QFlagsStorage<Qt::AlignmentFlag>.i =
       (Int)QVar1.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
            super_QFlagsStorage<Qt::AlignmentFlag>.i;
  operator=(in_RSI,in_RDI);
  return;
}

Assistant:

QStyleOptionComboBox(const QStyleOptionComboBox &other) : QStyleOptionComplex(Version, Type) { *this = other; }